

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::RepeatedField
          (RepeatedField<unsigned_int> *this,RepeatedField<unsigned_int> *other)

{
  RepeatedField<unsigned_int> *other_local;
  RepeatedField<unsigned_int> *this_local;
  
  this->current_size_ = 0;
  this->total_size_ = 0;
  this->rep_ = (Rep *)0x0;
  if (other->current_size_ != 0) {
    Reserve(this,other->current_size_);
    CopyArray(this,this->rep_->elements,other->rep_->elements,other->current_size_);
    this->current_size_ = other->current_size_;
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(const RepeatedField& other)
  : current_size_(0),
    total_size_(0),
    rep_(NULL) {
  if (other.current_size_ != 0) {
    Reserve(other.current_size_);
    CopyArray(rep_->elements,
              other.rep_->elements, other.current_size_);
    current_size_ = other.current_size_;
  }
}